

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_ps.c
# Opt level: O0

RK_S32 mpp_hevc_decode_nal_pps(HEVCContext *s)

{
  long lVar1;
  MPP_RET MVar2;
  int iVar3;
  RK_S32 RVar4;
  RK_U32 *pRVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  HEVCPPS *openhevc_pps;
  CurrentFameInf_t *info;
  undefined1 local_f8 [4];
  RK_S32 _out_39;
  RK_S32 _out_38;
  RK_S32 _out_37;
  RK_U32 _out_36;
  RK_S32 _out_35;
  RK_S32 _out_34;
  RK_S32 _out_33;
  RK_S32 _out_32;
  RK_S32 _out_31;
  RK_S32 _out_30;
  RK_S32 _out_29;
  RK_S32 _out_28;
  RK_S32 _out_27;
  RK_U32 _out_26;
  RK_U32 _out_25;
  RK_S32 sum;
  RK_S32 _out_24;
  RK_U32 _out_23;
  RK_U32 _out_22;
  RK_S32 max_supt_height;
  RK_S32 max_supt_width;
  MppDecHwCap *hw_info;
  RK_S32 _out_21;
  RK_S32 _out_20;
  RK_S32 _out_19;
  RK_S32 _out_18;
  RK_S32 _out_17;
  RK_S32 _out_16;
  RK_S32 _out_15;
  RK_S32 _out_14;
  RK_U32 _out_13;
  RK_S32 _out_12;
  RK_S32 _out_11;
  RK_S32 _out_10;
  RK_S32 _out_9;
  RK_U32 _out_8;
  RK_U32 _out_7;
  RK_S32 _out_6;
  RK_S32 _out_5;
  RK_S32 _out_4;
  RK_S32 _out_3;
  RK_S32 _out_2;
  RK_U32 _out_1;
  RK_U32 _out;
  RK_S32 i;
  RK_S32 ret;
  RK_U32 pps_id;
  RK_S32 buf_size;
  HevcPpsBufInfo *bufs;
  HEVCPPS *pps;
  HEVCSPS *sps;
  BitReadCtx_t *gb;
  HEVCContext *s_local;
  
  sps = (HEVCSPS *)s->HEVClc;
  pps = (HEVCPPS *)0x0;
  gb = (BitReadCtx_t *)s;
  bufs = (HevcPpsBufInfo *)mpp_osal_calloc("mpp_hevc_decode_nal_pps",0x690);
  _pps_id = (HevcPpsBufInfo *)0x0;
  ret = 0;
  i = 0;
  _out = 0;
  if ((h265d_debug & 1) != 0) {
    _mpp_log_l(4,"H265PARSER_PS","Decoding PPS\n",(char *)0x0);
  }
  if (bufs == (HevcPpsBufInfo *)0x0) {
    return -0x3ee;
  }
  MVar2 = mpp_read_ue((BitReadCtx_t *)sps,(RK_U32 *)&_out_2);
  sps->pix_fmt = MVar2;
  if (sps->pix_fmt == 0) {
    i = _out_2;
    if (0x3f < (uint)_out_2) {
      _mpp_log_l(2,"H265PARSER_PS","PPS id out of range: %d\n",(char *)0x0,(ulong)(uint)_out_2);
      _out = 0xfffffc14;
      goto LAB_001e5184;
    }
    _pps_id = bufs;
    if ((&gb[3].emulation_prevention_bytes_)[(uint)_out_2] != 0) {
      _pps_id = (HevcPpsBufInfo *)(&gb[3].emulation_prevention_bytes_)[(uint)_out_2];
    }
    _pps_id = _pps_id + 0x45;
    *(RK_S32 *)((long)&bufs->column_width + 4) = _out_2;
    *(undefined1 *)((long)&bufs[2].row_height + 1) = 1;
    *(undefined4 *)&bufs[2].column_width = 1;
    *(undefined4 *)((long)&bufs[2].column_width + 4) = 1;
    *(undefined1 *)&bufs[2].row_height = 1;
    *(undefined1 *)((long)&bufs[2].row_height + 5) = 0;
    bufs[2].column_width_size = 0;
    bufs[2].row_height_size = 0;
    MVar2 = mpp_read_ue((BitReadCtx_t *)sps,(RK_U32 *)&_out_3);
    sps->pix_fmt = MVar2;
    if (sps->pix_fmt == 0) {
      *(RK_S32 *)&bufs->column_width = _out_3;
      if (0xf < *(uint *)&bufs->column_width) {
        _mpp_log_l(2,"H265PARSER_PS","SPS id out of range: %d\n",(char *)0x0,
                   (ulong)*(uint *)&bufs->column_width);
        _out = 0xfffffc14;
        goto LAB_001e5184;
      }
      if ((&gb[2].data_)[*(uint *)&bufs->column_width] == (RK_U8 *)0x0) {
        _mpp_log_l(2,"H265PARSER_PS","SPS %u does not exist.\n",(char *)0x0,
                   (ulong)*(uint *)&bufs->column_width);
        _out = 0xfffffc14;
        goto LAB_001e5184;
      }
      pps = (HEVCPPS *)(&gb[2].data_)[*(uint *)&bufs->column_width];
      if ((h265d_debug & 1) != 0) {
        _mpp_log_l(4,"H265PARSER_PS","Decoding PPS 1\n",(char *)0x0);
      }
      MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,&_out_4);
      sps->pix_fmt = MVar2;
      if (sps->pix_fmt == 0) {
        *(undefined1 *)((long)&bufs[1].row_height_size + 1) = (undefined1)_out_4;
        MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,&_out_5);
        sps->pix_fmt = MVar2;
        if (sps->pix_fmt == 0) {
          *(undefined1 *)((long)&bufs[1].column_width_size + 3) = (undefined1)_out_5;
          MVar2 = mpp_read_bits((BitReadCtx_t *)sps,3,&_out_6);
          sps->pix_fmt = MVar2;
          if (sps->pix_fmt == 0) {
            bufs[0x43].row_height_size = _out_6;
            MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,(RK_S32 *)&_out_7);
            sps->pix_fmt = MVar2;
            if (sps->pix_fmt == 0) {
              *(undefined1 *)&bufs->row_height = (undefined1)_out_7;
              MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,(RK_S32 *)&_out_8);
              sps->pix_fmt = MVar2;
              if (sps->pix_fmt == 0) {
                *(undefined1 *)((long)&bufs->row_height + 1) = (undefined1)_out_8;
                MVar2 = mpp_read_ue((BitReadCtx_t *)sps,(RK_U32 *)&_out_9);
                sps->pix_fmt = MVar2;
                if (sps->pix_fmt == 0) {
                  *(RK_S32 *)((long)&bufs->row_height + 4) = _out_9;
                  *(int *)((long)&bufs->row_height + 4) = *(int *)((long)&bufs->row_height + 4) + 1;
                  MVar2 = mpp_read_ue((BitReadCtx_t *)sps,(RK_U32 *)&_out_10);
                  sps->pix_fmt = MVar2;
                  if (sps->pix_fmt == 0) {
                    bufs->column_width_size = _out_10;
                    bufs->column_width_size = bufs->column_width_size + 1;
                    MVar2 = mpp_read_se((BitReadCtx_t *)sps,&_out_11);
                    sps->pix_fmt = MVar2;
                    if (sps->pix_fmt == 0) {
                      bufs->row_height_size = _out_11;
                      MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,&_out_12);
                      sps->pix_fmt = MVar2;
                      if (sps->pix_fmt == 0) {
                        *(undefined1 *)&bufs[1].column_width = (undefined1)_out_12;
                        MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,(RK_S32 *)&_out_13);
                        sps->pix_fmt = MVar2;
                        if (sps->pix_fmt == 0) {
                          *(undefined1 *)((long)&bufs[1].column_width + 1) = (undefined1)_out_13;
                          MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,&_out_14);
                          sps->pix_fmt = MVar2;
                          if (sps->pix_fmt == 0) {
                            *(undefined1 *)((long)&bufs[1].column_width + 2) = (undefined1)_out_14;
                            *(undefined4 *)((long)&bufs[1].column_width + 4) = 0;
                            if (*(char *)((long)&bufs[1].column_width + 2) != '\0') {
                              MVar2 = mpp_read_ue((BitReadCtx_t *)sps,(RK_U32 *)&_out_15);
                              sps->pix_fmt = MVar2;
                              if (sps->pix_fmt != 0) goto LAB_001e517d;
                              *(RK_S32 *)((long)&bufs[1].column_width + 4) = _out_15;
                            }
                            MVar2 = mpp_read_se((BitReadCtx_t *)sps,&_out_16);
                            sps->pix_fmt = MVar2;
                            if (sps->pix_fmt == 0) {
                              *(RK_S32 *)&bufs[1].row_height = _out_16;
                              if ((*(int *)&bufs[1].row_height < -0xc) ||
                                 (0xc < *(int *)&bufs[1].row_height)) {
                                _mpp_log_l(2,"H265PARSER_PS","pps_cb_qp_offset out of range: %d\n",
                                           (char *)0x0,(ulong)*(uint *)&bufs[1].row_height);
                                _out = 0xfffffc14;
                                goto LAB_001e5184;
                              }
                              MVar2 = mpp_read_se((BitReadCtx_t *)sps,&_out_17);
                              sps->pix_fmt = MVar2;
                              if (sps->pix_fmt == 0) {
                                *(RK_S32 *)((long)&bufs[1].row_height + 4) = _out_17;
                                if ((*(int *)((long)&bufs[1].row_height + 4) < -0xc) ||
                                   (0xc < *(int *)((long)&bufs[1].row_height + 4))) {
                                  _mpp_log_l(2,"H265PARSER_PS","pps_cr_qp_offset out of range: %d\n"
                                             ,(char *)0x0,
                                             (ulong)*(uint *)((long)&bufs[1].row_height + 4));
                                  _out = 0xfffffc14;
                                  goto LAB_001e5184;
                                }
                                MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,&_out_18);
                                sps->pix_fmt = MVar2;
                                if (sps->pix_fmt == 0) {
                                  *(undefined1 *)&bufs[1].column_width_size = (undefined1)_out_18;
                                  MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,&_out_19);
                                  sps->pix_fmt = MVar2;
                                  if (sps->pix_fmt == 0) {
                                    *(undefined1 *)((long)&bufs[1].column_width_size + 1) =
                                         (undefined1)_out_19;
                                    MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,&_out_20);
                                    sps->pix_fmt = MVar2;
                                    if (sps->pix_fmt == 0) {
                                      *(undefined1 *)((long)&bufs[1].column_width_size + 2) =
                                           (undefined1)_out_20;
                                      MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,&_out_21);
                                      sps->pix_fmt = MVar2;
                                      if (sps->pix_fmt == 0) {
                                        *(undefined1 *)&bufs[1].row_height_size =
                                             (undefined1)_out_21;
                                        MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,
                                                              (RK_S32 *)((long)&hw_info + 4));
                                        sps->pix_fmt = MVar2;
                                        if (sps->pix_fmt == 0) {
                                          *(undefined1 *)((long)&bufs[1].row_height_size + 2) =
                                               hw_info._4_1_;
                                          MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,
                                                                (RK_S32 *)&hw_info);
                                          sps->pix_fmt = MVar2;
                                          if (sps->pix_fmt == 0) {
                                            *(undefined1 *)((long)&bufs[1].row_height_size + 3) =
                                                 hw_info._0_1_;
                                            if (*(long *)(gb->data_ + 0x58) != 0) {
                                              _max_supt_height = *(long *)(gb->data_ + 0x58);
                                              if ((*(ulong *)(_max_supt_height + 4) >> 0x14 & 1) ==
                                                  0) {
                                                iVar3 = *(int *)(pps[8].scaling_list.sl[0][4] + 0x33
                                                                ) *
                                                        *(int *)(pps[8].scaling_list.sl[0][4] + 0x37
                                                                );
                                                uVar6 = (uint)(*(ulong *)(_max_supt_height + 4) >>
                                                              0x15) & 7;
                                                iVar7 = uVar6 * 0x4000000;
                                                if (iVar3 != iVar7 &&
                                                    SBORROW4(iVar3,iVar7) ==
                                                    (int)(iVar3 + uVar6 * -0x4000000) < 0) {
                                                  _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                          
                                                  "cannot support %dx%d, max solution %dx%d\n",
                                                  (char *)0x0,
                                                  (ulong)*(uint *)(pps[8].scaling_list.sl[0][4] +
                                                                  0x33),
                                                  (ulong)*(uint *)(pps[8].scaling_list.sl[0][4] +
                                                                  0x37),0x2000,0x2000);
                                                  goto LAB_001e5184;
                                                }
                                              }
                                              else {
                                                _out_22 = 0x780;
                                                _out_23 = 0x780;
                                                if (*(char *)((long)&bufs[1].row_height_size + 2) !=
                                                    '\0') {
                                                  _out_23 = 0x440;
                                                }
                                                if ((_max_supt_height == 0) ||
                                                   ((*(ulong *)(_max_supt_height + 4) >> 0xd & 1) ==
                                                    0)) {
                                                  if ((_max_supt_height != 0) &&
                                                     ((*(ulong *)(_max_supt_height + 4) >> 0xc & 1)
                                                      != 0)) {
                                                    _out_22 = 0x1000;
                                                    _out_23 = 0x1000;
                                                    if (*(char *)((long)&bufs[1].row_height_size + 2
                                                                 ) != '\0') {
                                                      _out_23 = 0x900;
                                                    }
                                                  }
                                                }
                                                else {
                                                  _out_22 = 0x2000;
                                                  _out_23 = 0x2000;
                                                  if (*(char *)((long)&bufs[1].row_height_size + 2)
                                                      != '\0') {
                                                    _out_23 = 0x10e0;
                                                  }
                                                }
                                                if (((int)_out_22 <
                                                     *(int *)(pps[8].scaling_list.sl[0][4] + 0x33))
                                                   || ((((int)_out_23 <
                                                         *(int *)(pps[8].scaling_list.sl[0][4] +
                                                                 0x37) &&
                                                        (*(char *)((long)&bufs[1].row_height_size +
                                                                  2) != '\0')) ||
                                                       ((int)(_out_22 * _out_22) <
                                                        *(int *)(pps[8].scaling_list.sl[0][4] + 0x33
                                                                ) *
                                                        *(int *)(pps[8].scaling_list.sl[0][4] + 0x37
                                                                ))))) {
                                                  _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                          
                                                  "cannot support %dx%d, max solution %dx%d\n",
                                                  (char *)0x0,
                                                  (ulong)*(uint *)(pps[8].scaling_list.sl[0][4] +
                                                                  0x33),
                                                  (ulong)*(uint *)(pps[8].scaling_list.sl[0][4] +
                                                                  0x37),_out_22,_out_23);
                                                  goto LAB_001e5184;
                                                }
                                              }
                                            }
                                            if (*(char *)((long)&bufs[1].row_height_size + 2) ==
                                                '\0') {
LAB_001e4878:
                                              MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,&_out_30);
                                              sps->pix_fmt = MVar2;
                                              if (sps->pix_fmt == 0) {
                                                *(undefined1 *)((long)&bufs[2].row_height + 2) =
                                                     (undefined1)_out_30;
                                                MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,&_out_31
                                                                     );
                                                sps->pix_fmt = MVar2;
                                                if (sps->pix_fmt == 0) {
                                                  *(undefined1 *)((long)&bufs[2].row_height + 3) =
                                                       (undefined1)_out_31;
                                                  if (*(char *)((long)&bufs[2].row_height + 3) ==
                                                      '\0') goto LAB_001e4afc;
                                                  MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,
                                                                        &_out_32);
                                                  sps->pix_fmt = MVar2;
                                                  if (sps->pix_fmt == 0) {
                                                    *(undefined1 *)((long)&bufs[2].row_height + 4) =
                                                         (undefined1)_out_32;
                                                    MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,
                                                                          &_out_33);
                                                    sps->pix_fmt = MVar2;
                                                    if (sps->pix_fmt == 0) {
                                                      *(undefined1 *)((long)&bufs[2].row_height + 5)
                                                           = (undefined1)_out_33;
                                                      if (*(char *)((long)&bufs[2].row_height + 5)
                                                          == '\0') {
                                                        MVar2 = mpp_read_se((BitReadCtx_t *)sps,
                                                                            &_out_34);
                                                        sps->pix_fmt = MVar2;
                                                        if (sps->pix_fmt == 0) {
                                                          bufs[2].column_width_size = _out_34;
                                                          bufs[2].column_width_size =
                                                               bufs[2].column_width_size << 1;
                                                          MVar2 = mpp_read_se((BitReadCtx_t *)sps,
                                                                              &_out_35);
                                                          sps->pix_fmt = MVar2;
                                                          if (sps->pix_fmt == 0) {
                                                            bufs[2].row_height_size = _out_35;
                                                            bufs[2].row_height_size =
                                                                 bufs[2].row_height_size << 1;
                                                            if ((bufs[2].column_width_size / 2 < -6)
                                                               || (6 < bufs[2].column_width_size / 2
                                                                  )) {
                                                              _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                                                  
                                                  "pps_beta_offset_div2 out of range: %d\n",
                                                  (char *)0x0,
                                                  (long)bufs[2].column_width_size / 2 & 0xffffffff);
                                                  _out = 0xfffffc14;
                                                  goto LAB_001e5184;
                                                  }
                                                  if ((bufs[2].row_height_size / 2 < -6) ||
                                                     (6 < bufs[2].row_height_size / 2)) {
                                                    _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                              
                                                  "pps_tc_offset_div2 out of range: %d\n",
                                                  (char *)0x0,
                                                  (long)bufs[2].row_height_size / 2 & 0xffffffff);
                                                  _out = 0xfffffc14;
                                                  goto LAB_001e5184;
                                                  }
                                                  goto LAB_001e4afc;
                                                  }
                                                  }
                                                  }
                                                  else {
LAB_001e4afc:
                                                    MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,
                                                                          (RK_S32 *)&_out_36);
                                                    sps->pix_fmt = MVar2;
                                                    if (sps->pix_fmt == 0) {
                                                      *(undefined1 *)&bufs[3].column_width =
                                                           (undefined1)_out_36;
                                                      if (*(char *)&bufs[3].column_width != '\0') {
                                                        set_default_scaling_list_data
                                                                  ((ScalingList *)
                                                                   ((long)&bufs[3].column_width + 1)
                                                                  );
                                                        _out = scaling_list_data((HEVCContext *)gb,
                                                                                 (ScalingList *)
                                                                                 ((long)&bufs[3].
                                                  column_width + 1),(HEVCSPS *)pps);
                                                  if ((int)_out < 0) goto LAB_001e5184;
                                                  *(undefined1 *)
                                                   ((long)&gb[0x516].update_curbyte +
                                                   (ulong)(i + 0x10) + 4) = 1;
                                                  }
                                                  if ((h265d_debug & 8) != 0) {
                                                    _mpp_log_l(4,"H265PARSER_PS","num bit left %d",
                                                               (char *)0x0,
                                                               (ulong)(uint)(sps->output_window).
                                                                            left_offset);
                                                  }
                                                  MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,
                                                                        &_out_37);
                                                  sps->pix_fmt = MVar2;
                                                  if (sps->pix_fmt == 0) {
                                                    *(undefined1 *)
                                                     ((long)&bufs[0x43].row_height + 5) =
                                                         (undefined1)_out_37;
                                                    if ((h265d_debug & 8) != 0) {
                                                      _mpp_log_l(4,"H265PARSER_PS","num bit left %d"
                                                                 ,(char *)0x0,
                                                                 (ulong)(uint)(sps->output_window).
                                                                              left_offset);
                                                    }
                                                    MVar2 = mpp_read_ue((BitReadCtx_t *)sps,
                                                                        (RK_U32 *)&_out_38);
                                                    sps->pix_fmt = MVar2;
                                                    if (sps->pix_fmt == 0) {
                                                      bufs[0x43].column_width_size = _out_38;
                                                      if ((h265d_debug & 8) != 0) {
                                                        _mpp_log_l(4,"H265PARSER_PS",
                                                                   "num bit left %d",(char *)0x0,
                                                                   (ulong)(uint)(sps->output_window)
                                                                                .left_offset);
                                                      }
                                                      bufs[0x43].column_width_size =
                                                           bufs[0x43].column_width_size + 2;
                                                      if (*(int *)(pps[8].scaling_list.sl[0][3] +
                                                                  0x37) <
                                                          bufs[0x43].column_width_size) {
                                                        _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                                      
                                                  "log2_parallel_merge_level_minus2 out of range: %d\n"
                                                  ,(char *)0x0,
                                                  (ulong)(bufs[0x43].column_width_size - 2));
                                                  _out = 0xfffffc14;
                                                  goto LAB_001e5184;
                                                  }
                                                  MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,
                                                                        &_out_39);
                                                  sps->pix_fmt = MVar2;
                                                  if (sps->pix_fmt == 0) {
                                                    *(undefined1 *)&bufs[0x44].column_width =
                                                         (undefined1)_out_39;
                                                    MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,
                                                                          (RK_S32 *)local_f8);
                                                    sps->pix_fmt = MVar2;
                                                    if (sps->pix_fmt == 0) {
                                                      *(undefined1 *)
                                                       ((long)&bufs[0x44].column_width + 1) =
                                                           local_f8[0];
                                                      if ((h265d_debug & 8) != 0) {
                                                        _mpp_log_l(4,"H265PARSER_PS",
                                                                   "pps_extension_flag %d",
                                                                   (char *)0x0,
                                                                   (ulong)*(byte *)((long)&bufs[0x44
                                                  ].column_width + 1));
                                                  }
                                                  if (*(char *)((long)&bufs[0x44].column_width + 1)
                                                      == '\0') {
LAB_001e4e69:
                                                    if (*(long *)(gb->data_ + 0x48) != 0) {
                                                      lVar1 = *(long *)(gb->data_ + 0x48);
                                                      uVar8 = (ulong)(uint)i;
                                                      _mpp_log_l(4,"H265PARSER_PS","compare pps in",
                                                                 (char *)0x0);
                                                      RVar4 = compare_pps((HEVCPPS *)
                                                                          (lVar1 + 0x39b80 +
                                                                          uVar8 * 0x690),
                                                                          (HEVCPPS *)bufs);
                                                      if (RVar4 < 0) {
                                                        _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                                      
                                                  "compare pps with openhevc error found",
                                                  (char *)0x0);
                                                  _mpp_log_l(2,"H265PARSER_PS",
                                                             "Assertion %s failed at %s:%d\n",
                                                             (char *)0x0,"0",
                                                             "mpp_hevc_decode_nal_pps",0x88b);
                                                  if ((mpp_debug & 0x10000000) == 0) {
                                                    return -1;
                                                  }
                                                  abort();
                                                  }
                                                  _mpp_log_l(4,"H265PARSER_PS","compare pps ok",
                                                             (char *)0x0);
                                                  }
                                                  if (*(char *)&bufs[2].row_height == '\0') {
LAB_001e50fb:
                                                    if ((&gb[3].emulation_prevention_bytes_)
                                                        [(uint)i] == 0) {
                                                      (&gb[3].emulation_prevention_bytes_)[(uint)i]
                                                           = (RK_S64)bufs;
                                                    }
                                                    else {
                                                      memcpy((void *)(&gb[3].
                                                  emulation_prevention_bytes_)[(uint)i],bufs,0x678);
                                                  mpp_hevc_pps_free((RK_U8 *)bufs);
                                                  }
                                                  *(undefined1 *)
                                                   ((long)&gb[0x6cf].
                                                           num_remaining_bits_in_curr_byte_ + 3) = 1
                                                  ;
                                                  if ((&gb[3].emulation_prevention_bytes_)[(uint)i]
                                                      != 0) {
                                                    *(undefined1 *)
                                                     ((long)&gb[0x518].data_ + (ulong)(uint)i + 5) =
                                                         1;
                                                  }
                                                  return 0;
                                                  }
                                                  ret = *(int *)&bufs[2].column_width << 2;
                                                  if (_pps_id->column_width_size < ret) {
                                                    pRVar5 = (RK_U32 *)
                                                             mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)ret);
                                                  _pps_id->column_width = pRVar5;
                                                  _pps_id->column_width_size = ret;
                                                  }
                                                  ret = *(int *)((long)&bufs[2].column_width + 4) <<
                                                        2;
                                                  if (_pps_id->row_height_size < ret) {
                                                    pRVar5 = (RK_U32 *)
                                                             mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)ret);
                                                  _pps_id->row_height = pRVar5;
                                                  _pps_id->row_height_size = ret;
                                                  }
                                                  if ((_pps_id->column_width != (RK_U32 *)0x0) &&
                                                     (_pps_id->row_height != (RK_U32 *)0x0)) {
                                                    for (_out_1 = 0;
                                                        (int)_out_1 < *(int *)&bufs[2].column_width;
                                                        _out_1 = _out_1 + 1) {
                                                      _pps_id->column_width[(int)_out_1] =
                                                           (int)((_out_1 + 1) *
                                                                *(int *)(pps[8].scaling_list.sl[0]
                                                                         [4] + 0x3b)) /
                                                           *(int *)&bufs[2].column_width -
                                                           (int)(_out_1 * *(int *)(pps[8].
                                                  scaling_list.sl[0][4] + 0x3b)) /
                                                  *(int *)&bufs[2].column_width;
                                                  }
                                                  for (_out_1 = 0;
                                                      (int)_out_1 <
                                                      *(int *)((long)&bufs[2].column_width + 4);
                                                      _out_1 = _out_1 + 1) {
                                                    _pps_id->row_height[(int)_out_1] =
                                                         (int)((_out_1 + 1) *
                                                              *(int *)(pps[8].scaling_list.sl[0][4]
                                                                      + 0x3f)) /
                                                         *(int *)((long)&bufs[2].column_width + 4) -
                                                         (int)(_out_1 * *(int *)(pps[8].scaling_list
                                                                                 .sl[0][4] + 0x3f))
                                                         / *(int *)((long)&bufs[2].column_width + 4)
                                                    ;
                                                  }
                                                  goto LAB_001e50fb;
                                                  }
                                                  _out = 0xfffffc12;
                                                  goto LAB_001e5184;
                                                  }
                                                  MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,
                                                                        (RK_S32 *)((long)&info + 4))
                                                  ;
                                                  sps->pix_fmt = MVar2;
                                                  if (sps->pix_fmt == 0) {
                                                    *(undefined1 *)
                                                     ((long)&bufs[0x44].column_width + 2) =
                                                         info._4_1_;
                                                    MVar2 = mpp_skip_longbits((BitReadCtx_t *)sps,7)
                                                    ;
                                                    sps->pix_fmt = MVar2;
                                                    if (sps->pix_fmt == 0) goto LAB_001e4e69;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                            else {
                                              MVar2 = mpp_read_ue((BitReadCtx_t *)sps,
                                                                  (RK_U32 *)&_out_24);
                                              sps->pix_fmt = MVar2;
                                              if (sps->pix_fmt == 0) {
                                                *(RK_S32 *)&bufs[2].column_width = _out_24;
                                                *(int *)&bufs[2].column_width =
                                                     *(int *)&bufs[2].column_width + 1;
                                                MVar2 = mpp_read_ue((BitReadCtx_t *)sps,
                                                                    (RK_U32 *)&sum);
                                                sps->pix_fmt = MVar2;
                                                if (sps->pix_fmt == 0) {
                                                  *(RK_S32 *)((long)&bufs[2].column_width + 4) = sum
                                                  ;
                                                  *(int *)((long)&bufs[2].column_width + 4) =
                                                       *(int *)((long)&bufs[2].column_width + 4) + 1
                                                  ;
                                                  if ((*(int *)&bufs[2].column_width == 0) ||
                                                     (*(int *)(pps[8].scaling_list.sl[0][4] + 0x33)
                                                      <= *(int *)&bufs[2].column_width)) {
                                                    _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                              
                                                  "num_tile_columns_minus1 out of range: %d\n",
                                                  (char *)0x0,
                                                  (ulong)(*(int *)&bufs[2].column_width - 1));
                                                  _out = 0xfffffc14;
                                                  goto LAB_001e5184;
                                                  }
                                                  if ((*(int *)((long)&bufs[2].column_width + 4) ==
                                                       0) || (*(int *)(pps[8].scaling_list.sl[0][4]
                                                                      + 0x37) <=
                                                              *(int *)((long)&bufs[2].column_width +
                                                                      4))) {
                                                    _mpp_log_l(2,"H265PARSER_PS",
                                                                                                                              
                                                  "num_tile_rows_minus1 out of range: %d\n",
                                                  (char *)0x0,
                                                  (ulong)(*(int *)((long)&bufs[2].column_width + 4)
                                                         - 1));
                                                  _out = 0xfffffc14;
                                                  goto LAB_001e5184;
                                                  }
                                                  ret = *(int *)&bufs[2].column_width << 2;
                                                  if (_pps_id->column_width_size < ret) {
                                                    pRVar5 = (RK_U32 *)
                                                             mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)ret);
                                                  _pps_id->column_width = pRVar5;
                                                  _pps_id->column_width_size = ret;
                                                  }
                                                  ret = *(int *)((long)&bufs[2].column_width + 4) <<
                                                        2;
                                                  if (_pps_id->row_height_size < ret) {
                                                    pRVar5 = (RK_U32 *)
                                                             mpp_osal_malloc(
                                                  "mpp_hevc_decode_nal_pps",(long)ret);
                                                  _pps_id->row_height = pRVar5;
                                                  _pps_id->row_height_size = ret;
                                                  }
                                                  if ((_pps_id->column_width == (RK_U32 *)0x0) ||
                                                     (_pps_id->row_height == (RK_U32 *)0x0)) {
                                                    _out = 0xfffffc12;
                                                    goto LAB_001e5184;
                                                  }
                                                  MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,
                                                                        (RK_S32 *)&_out_25);
                                                  sps->pix_fmt = MVar2;
                                                  if (sps->pix_fmt == 0) {
                                                    *(undefined1 *)&bufs[2].row_height =
                                                         (undefined1)_out_25;
                                                    if (*(char *)&bufs[2].row_height == '\0') {
                                                      _out_26 = 0;
                                                      for (_out_1 = 0;
                                                          (int)_out_1 <
                                                          *(int *)&bufs[2].column_width + -1;
                                                          _out_1 = _out_1 + 1) {
                                                        MVar2 = mpp_read_ue((BitReadCtx_t *)sps,
                                                                            (RK_U32 *)&_out_27);
                                                        sps->pix_fmt = MVar2;
                                                        if (sps->pix_fmt != 0) goto LAB_001e517d;
                                                        _pps_id->column_width[(int)_out_1] = _out_27
                                                        ;
                                                        _pps_id->column_width[(int)_out_1] =
                                                             _pps_id->column_width[(int)_out_1] + 1;
                                                        _out_26 = _pps_id->column_width[(int)_out_1]
                                                                  + _out_26;
                                                      }
                                                      if (*(int *)(pps[8].scaling_list.sl[0][4] +
                                                                  0x3b) <= (int)_out_26) {
                                                        _mpp_log_l(2,"H265PARSER_PS",
                                                                   "Invalid tile widths.\n",
                                                                   (char *)0x0);
                                                        _out = 0xfffffc14;
                                                        goto LAB_001e5184;
                                                      }
                                                      _pps_id->column_width
                                                      [*(int *)&bufs[2].column_width + -1] =
                                                           *(int *)(pps[8].scaling_list.sl[0][4] +
                                                                   0x3b) - _out_26;
                                                      _out_26 = 0;
                                                      _out_1 = 0;
                                                      while( true ) {
                                                        if (*(int *)((long)&bufs[2].column_width + 4
                                                                    ) + -1 <= (int)_out_1) break;
                                                        MVar2 = mpp_read_ue((BitReadCtx_t *)sps,
                                                                            (RK_U32 *)&_out_28);
                                                        sps->pix_fmt = MVar2;
                                                        if (sps->pix_fmt != 0) goto LAB_001e517d;
                                                        _pps_id->row_height[(int)_out_1] = _out_28;
                                                        _pps_id->row_height[(int)_out_1] =
                                                             _pps_id->row_height[(int)_out_1] + 1;
                                                        _out_26 = _pps_id->row_height[(int)_out_1] +
                                                                  _out_26;
                                                        _out_1 = _out_1 + 1;
                                                      }
                                                      if (*(int *)(pps[8].scaling_list.sl[0][4] +
                                                                  0x3f) <= (int)_out_26) {
                                                        _mpp_log_l(2,"H265PARSER_PS",
                                                                   "Invalid tile heights.\n",
                                                                   (char *)0x0);
                                                        _out = 0xfffffc14;
                                                        goto LAB_001e5184;
                                                      }
                                                      _pps_id->row_height
                                                      [*(int *)((long)&bufs[2].column_width + 4) +
                                                       -1] = *(int *)(pps[8].scaling_list.sl[0][4] +
                                                                     0x3f) - _out_26;
                                                    }
                                                    MVar2 = mpp_read_bits((BitReadCtx_t *)sps,1,
                                                                          &_out_29);
                                                    sps->pix_fmt = MVar2;
                                                    if (sps->pix_fmt == 0) {
                                                      *(undefined1 *)((long)&bufs[2].row_height + 1)
                                                           = (undefined1)_out_29;
                                                      goto LAB_001e4878;
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_001e517d:
  _out = 0xfffffc14;
LAB_001e5184:
  if (bufs != (HevcPpsBufInfo *)0x0) {
    mpp_hevc_pps_free((RK_U8 *)bufs);
  }
  return _out;
}

Assistant:

int mpp_hevc_decode_nal_pps(HEVCContext *s)
{
    BitReadCtx_t *gb = &s->HEVClc->gb;
    HEVCSPS *sps = NULL;
    HEVCPPS *pps = mpp_calloc(HEVCPPS, 1);
    HevcPpsBufInfo *bufs = NULL;
    RK_S32 buf_size = 0;
    RK_U32 pps_id = 0;
    RK_S32 ret = 0;
    RK_S32 i;

    h265d_dbg(H265D_DBG_FUNCTION, "Decoding PPS\n");

    if (!pps)
        return MPP_ERR_NOMEM;

    // Coded parameters
    READ_UE(gb, &pps_id);
    if (pps_id >= MAX_PPS_COUNT) {
        mpp_err( "PPS id out of range: %d\n", pps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }

    if (s->pps_list[pps_id]) {
        bufs = &(((HEVCPPS *)s->pps_list[pps_id])->bufs);
    } else {
        bufs = &pps->bufs;
    }

    pps->pps_id = pps_id;
    // Default values
    pps->loop_filter_across_tiles_enabled_flag = 1;
    pps->num_tile_columns                      = 1;
    pps->num_tile_rows                         = 1;
    pps->uniform_spacing_flag                  = 1;
    pps->disable_dbf                           = 0;
    pps->beta_offset                           = 0;
    pps->tc_offset                             = 0;

    READ_UE(gb, &pps->sps_id);
    if (pps->sps_id >= MAX_SPS_COUNT) {
        mpp_err( "SPS id out of range: %d\n", pps->sps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    if (!s->sps_list[pps->sps_id]) {
        mpp_err( "SPS %u does not exist.\n", pps->sps_id);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    sps = (HEVCSPS *)s->sps_list[pps->sps_id];

    h265d_dbg(H265D_DBG_FUNCTION, "Decoding PPS 1\n");
    READ_ONEBIT(gb, &pps->dependent_slice_segments_enabled_flag);
    READ_ONEBIT(gb, &pps->output_flag_present_flag );
    READ_BITS(gb, 3, &pps->num_extra_slice_header_bits);

    READ_ONEBIT(gb, &pps->sign_data_hiding_flag);

    READ_ONEBIT(gb, &pps->cabac_init_present_flag);

    READ_UE(gb, &pps->num_ref_idx_l0_default_active);
    pps->num_ref_idx_l0_default_active +=  1;
    READ_UE(gb, &pps->num_ref_idx_l1_default_active);
    pps->num_ref_idx_l1_default_active += 1;

    READ_SE(gb, &pps->pic_init_qp_minus26);

    READ_ONEBIT(gb, & pps->constrained_intra_pred_flag);
    READ_ONEBIT(gb, &pps->transform_skip_enabled_flag);

    READ_ONEBIT(gb, &pps->cu_qp_delta_enabled_flag);
    pps->diff_cu_qp_delta_depth   = 0;
    if (pps->cu_qp_delta_enabled_flag)
        READ_UE(gb, &pps->diff_cu_qp_delta_depth);

    READ_SE(gb, &pps->cb_qp_offset);
    if (pps->cb_qp_offset < -12 || pps->cb_qp_offset > 12) {
        mpp_err( "pps_cb_qp_offset out of range: %d\n",
                 pps->cb_qp_offset);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_SE(gb, &pps->cr_qp_offset);
    if (pps->cr_qp_offset < -12 || pps->cr_qp_offset > 12) {
        mpp_err( "pps_cr_qp_offset out of range: %d\n",
                 pps->cr_qp_offset);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_ONEBIT(gb, &pps->pic_slice_level_chroma_qp_offsets_present_flag);

    READ_ONEBIT(gb, &pps->weighted_pred_flag);

    READ_ONEBIT(gb, &pps->weighted_bipred_flag);

    READ_ONEBIT(gb, &pps->transquant_bypass_enable_flag);
    READ_ONEBIT(gb, &pps->tiles_enabled_flag);
    READ_ONEBIT(gb, &pps->entropy_coding_sync_enabled_flag);

    // check support solution
    if (s->h265dctx->hw_info) {
        const MppDecHwCap *hw_info = s->h265dctx->hw_info;

        if (hw_info->cap_lmt_linebuf) {
            RK_S32 max_supt_width = PIXW_1080P;
            RK_S32 max_supt_height = pps->tiles_enabled_flag ? PIXH_1080P : PIXW_1080P;

            if (hw_info && hw_info->cap_8k) {
                max_supt_width = PIXW_8Kx4K;
                max_supt_height = pps->tiles_enabled_flag ? PIXH_8Kx4K : PIXW_8Kx4K;
            } else if (hw_info && hw_info->cap_4k) {
                max_supt_width = PIXW_4Kx2K;
                max_supt_height = pps->tiles_enabled_flag ? PIXH_4Kx2K : PIXW_4Kx2K;
            }

            if (sps->width > max_supt_width || (sps->height > max_supt_height && pps->tiles_enabled_flag)
                || sps->width * sps->height > max_supt_width * max_supt_width) {
                mpp_err("cannot support %dx%d, max solution %dx%d\n",
                        sps->width, sps->height, max_supt_width, max_supt_height);
                goto err;
            }
        } else {
            if (sps->width * sps->height > PIXW_8Kx4K * PIXW_8Kx4K * hw_info->cap_core_num) {
                mpp_err("cannot support %dx%d, max solution %dx%d\n",
                        sps->width, sps->height, PIXW_8Kx4K, PIXW_8Kx4K);
                goto err;
            }
        }
    }

    if (pps->tiles_enabled_flag) {
        READ_UE(gb, &pps->num_tile_columns);
        pps->num_tile_columns += 1;
        READ_UE(gb, &pps->num_tile_rows);
        pps->num_tile_rows += 1;
        if (pps->num_tile_columns == 0 ||
            pps->num_tile_columns >= sps->width) {
            mpp_err( "num_tile_columns_minus1 out of range: %d\n",
                     pps->num_tile_columns - 1);
            ret =  MPP_ERR_STREAM;
            goto err;
        }
        if (pps->num_tile_rows == 0 ||
            pps->num_tile_rows >= sps->height) {
            mpp_err( "num_tile_rows_minus1 out of range: %d\n",
                     pps->num_tile_rows - 1);
            ret =  MPP_ERR_STREAM;
            goto err;
        }

        buf_size = pps->num_tile_columns * sizeof(RK_U32);
        if (bufs->column_width_size < buf_size) {
            bufs->column_width = mpp_malloc_size(RK_U32, buf_size);
            bufs->column_width_size = buf_size;
        }

        buf_size = pps->num_tile_rows * sizeof(RK_U32);
        if (bufs->row_height_size < buf_size) {
            bufs->row_height = mpp_malloc_size(RK_U32, buf_size);
            bufs->row_height_size = buf_size;
        }

        if (!bufs->column_width || !bufs->row_height) {
            ret = MPP_ERR_NOMEM;
            goto err;
        }

        READ_ONEBIT(gb, &pps->uniform_spacing_flag );
        if (!pps->uniform_spacing_flag) {
            RK_S32 sum = 0;
            for (i = 0; i < pps->num_tile_columns - 1; i++) {
                READ_UE(gb, &bufs->column_width[i]);
                bufs->column_width[i] += 1;
                sum                   += bufs->column_width[i];
            }
            if (sum >= sps->ctb_width) {
                mpp_err( "Invalid tile widths.\n");
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            bufs->column_width[pps->num_tile_columns - 1] = sps->ctb_width - sum;

            sum = 0;
            for (i = 0; i < pps->num_tile_rows - 1; i++) {
                READ_UE(gb, &bufs->row_height[i]);
                bufs->row_height[i] += 1;
                sum                 += bufs->row_height[i];
            }
            if (sum >= sps->ctb_height) {
                mpp_err( "Invalid tile heights.\n");
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            bufs->row_height[pps->num_tile_rows - 1] = sps->ctb_height - sum;
        }
        READ_ONEBIT(gb, &pps->loop_filter_across_tiles_enabled_flag);
    }

    READ_ONEBIT(gb, &pps->seq_loop_filter_across_slices_enabled_flag);
    READ_ONEBIT(gb, &pps->deblocking_filter_control_present_flag);
    if (pps->deblocking_filter_control_present_flag) {
        READ_ONEBIT(gb, &pps->deblocking_filter_override_enabled_flag);
        READ_ONEBIT(gb, & pps->disable_dbf);
        if (!pps->disable_dbf) {
            READ_SE(gb, &pps->beta_offset);
            pps->beta_offset = pps->beta_offset * 2;
            READ_SE(gb, &pps->tc_offset);
            pps->tc_offset = pps->tc_offset * 2;
            if (pps->beta_offset / 2 < -6 || pps->beta_offset / 2 > 6) {
                mpp_err( "pps_beta_offset_div2 out of range: %d\n",
                         pps->beta_offset / 2);
                ret =  MPP_ERR_STREAM;
                goto err;
            }
            if (pps->tc_offset / 2 < -6 || pps->tc_offset / 2 > 6) {
                mpp_err( "pps_tc_offset_div2 out of range: %d\n",
                         pps->tc_offset / 2);
                ret =  MPP_ERR_STREAM;
                goto err;
            }
        }
    }

    READ_ONEBIT(gb, &pps->scaling_list_data_present_flag);
    if (pps->scaling_list_data_present_flag) {
        set_default_scaling_list_data(&pps->scaling_list);
        ret = scaling_list_data(s, &pps->scaling_list, sps);

        if (ret < 0)
            goto err;
        s->scaling_list_listen[pps_id + 16] = 1;
    }

    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    READ_ONEBIT(gb, & pps->lists_modification_present_flag);


    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    READ_UE(gb, &pps->log2_parallel_merge_level);

    h265d_dbg(H265D_DBG_PPS, "num bit left %d", gb->num_remaining_bits_in_curr_byte_);
    pps->log2_parallel_merge_level += 2;
    if (pps->log2_parallel_merge_level > sps->log2_ctb_size) {
        mpp_err( "log2_parallel_merge_level_minus2 out of range: %d\n",
                 pps->log2_parallel_merge_level - 2);
        ret =  MPP_ERR_STREAM;
        goto err;
    }
    READ_ONEBIT(gb, &pps->slice_header_extension_present_flag);
    READ_ONEBIT(gb, &pps->pps_extension_flag);
    h265d_dbg(H265D_DBG_PPS, "pps_extension_flag %d", pps->pps_extension_flag);
    if (pps->pps_extension_flag) {
        READ_ONEBIT(gb, &pps->pps_range_extensions_flag);
        SKIP_BITS(gb, 7); // pps_extension_7bits
    }

    if (s->h265dctx->compare_info != NULL) {
        CurrentFameInf_t *info = (CurrentFameInf_t *)s->h265dctx->compare_info;
        HEVCPPS *openhevc_pps = (HEVCPPS*)&info->pps[pps_id];
        mpp_log("compare pps in");
        if (compare_pps(openhevc_pps, (HEVCPPS*)pps) < 0) {
            mpp_err("compare pps with openhevc error found");
            mpp_assert(0);
            return -1;
        }
        mpp_log("compare pps ok");
    }

    // Inferred parameters
    if (pps->uniform_spacing_flag) {
        buf_size = pps->num_tile_columns * sizeof(RK_U32);
        if (bufs->column_width_size < buf_size) {
            bufs->column_width = mpp_malloc_size(RK_U32, buf_size);
            bufs->column_width_size = buf_size;
        }

        buf_size = pps->num_tile_rows * sizeof(RK_U32);
        if (bufs->row_height_size < buf_size) {
            bufs->row_height = mpp_malloc_size(RK_U32, buf_size);
            bufs->row_height_size = buf_size;
        }
        if (!bufs->column_width || !bufs->row_height) {
            ret = MPP_ERR_NOMEM;
            goto err;
        }

        for (i = 0; i < pps->num_tile_columns; i++) {
            bufs->column_width[i] = ((i + 1) * sps->ctb_width) / pps->num_tile_columns -
                                    (i * sps->ctb_width) / pps->num_tile_columns;
        }

        for (i = 0; i < pps->num_tile_rows; i++) {
            bufs->row_height[i] = ((i + 1) * sps->ctb_height) / pps->num_tile_rows -
                                  (i * sps->ctb_height) / pps->num_tile_rows;
        }
    }

    if (s->pps_list[pps_id]) {
        memcpy(s->pps_list[pps_id], pps, sizeof(*pps) - sizeof(pps->bufs));
        mpp_hevc_pps_free((RK_U8 *)pps);
    } else {
        s->pps_list[pps_id] = (RK_U8 *)pps;
    }
    s->ps_need_upate = 1;

    if (s->pps_list[pps_id])
        s->pps_list_of_updated[pps_id] = 1;

    return 0;
__BITREAD_ERR:
    ret = MPP_ERR_STREAM;
err:
    if (pps)
        mpp_hevc_pps_free((RK_U8 *)pps);

    return ret;
}